

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O0

int blake2s_init_param(blake2s_state *S,blake2s_param *P)

{
  uint32_t uVar1;
  ulong local_28;
  size_t i;
  uchar *p;
  blake2s_param *P_local;
  blake2s_state *S_local;
  
  blake2s_init0(S);
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    uVar1 = load32(P->salt + local_28 * 4 + -0x10);
    S->h[local_28] = uVar1 ^ S->h[local_28];
  }
  S->outlen = (ulong)P->digest_length;
  return 0;
}

Assistant:

int blake2s_init_param( blake2s_state *S, const blake2s_param *P )
{
  const unsigned char *p = ( const unsigned char * )( P );
  size_t i;

  blake2s_init0( S );

  /* IV XOR ParamBlock */
  for( i = 0; i < 8; ++i )
    S->h[i] ^= load32( &p[i * 4] );

  S->outlen = P->digest_length;
  return 0;
}